

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O3

int MMDB_read_node(MMDB_s *mmdb,uint32_t node_number,MMDB_search_node_s *node)

{
  ushort uVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ushort uVar9;
  ulong uVar10;
  byte bVar11;
  byte bVar12;
  
  uVar1 = mmdb->full_record_byte_size;
  uVar9 = uVar1 - 6;
  iVar7 = 6;
  if ((uVar9 < 3) && (iVar7 = 10, node_number <= (mmdb->metadata).node_count)) {
    uVar4 = (ulong)uVar9;
    puVar3 = mmdb->file_content;
    uVar5 = (*(code *)(&PTR_get_uint24_0010adb0)[uVar4])(puVar3 + uVar1 * node_number);
    node->left_record = (ulong)uVar5;
    uVar6 = (*(code *)(&PTR_get_uint24_0010adc8)[uVar4])
                      (puVar3 + uVar1 * node_number + *(long *)(&DAT_00107730 + uVar4 * 8));
    uVar8 = (ulong)uVar6;
    node->right_record = uVar8;
    uVar4 = node->left_record;
    uVar5 = (mmdb->metadata).node_count;
    uVar10 = (ulong)uVar5;
    bVar11 = 3;
    bVar12 = 3;
    if (uVar4 != 0) {
      if (uVar4 < uVar10) {
        bVar12 = 0;
      }
      else {
        bVar12 = 1;
        if (uVar4 != uVar10) {
          bVar12 = uVar4 - uVar10 < (ulong)mmdb->data_section_size ^ 3;
        }
      }
    }
    node->left_record_type = bVar12;
    if (uVar8 != 0) {
      if (uVar6 < uVar5) {
        bVar11 = 0;
      }
      else {
        bVar11 = 1;
        if (uVar5 != uVar6) {
          bVar11 = uVar8 - uVar10 < (ulong)mmdb->data_section_size ^ 3;
        }
      }
    }
    node->right_record_type = bVar11;
    (node->left_record_entry).mmdb = mmdb;
    (node->left_record_entry).offset = ((int)uVar4 - uVar5) - 0x10;
    uVar2 = (mmdb->metadata).node_count;
    (node->right_record_entry).mmdb = mmdb;
    (node->right_record_entry).offset = (uVar6 - uVar2) - 0x10;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int MMDB_read_node(const MMDB_s *const mmdb,
                   uint32_t node_number,
                   MMDB_search_node_s *const node) {
    record_info_s record_info = record_info_for_database(mmdb);
    if (record_info.right_record_offset == 0) {
        return MMDB_UNKNOWN_DATABASE_FORMAT_ERROR;
    }

    if (node_number > mmdb->metadata.node_count) {
        return MMDB_INVALID_NODE_NUMBER_ERROR;
    }

    const uint8_t *search_tree = mmdb->file_content;
    const uint8_t *record_pointer =
        &search_tree[node_number * record_info.record_length];
    node->left_record = record_info.left_record_getter(record_pointer);
    record_pointer += record_info.right_record_offset;
    node->right_record = record_info.right_record_getter(record_pointer);

    node->left_record_type = record_type(mmdb, node->left_record);
    node->right_record_type = record_type(mmdb, node->right_record);

    // Note that offset will be invalid if the record type is not
    // MMDB_RECORD_TYPE_DATA, but that's ok. Any use of the record entry
    // for other data types is a programming error.
    node->left_record_entry = (struct MMDB_entry_s){
        .mmdb = mmdb,
        .offset = data_section_offset_for_record(mmdb, node->left_record),
    };
    node->right_record_entry = (struct MMDB_entry_s){
        .mmdb = mmdb,
        .offset = data_section_offset_for_record(mmdb, node->right_record),
    };

    return MMDB_SUCCESS;
}